

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NwnStreams.h
# Opt level: O0

size_t __thiscall CNwnMemoryStream::Write(CNwnMemoryStream *this,void *pBuffer,size_t nCount)

{
  bool bVar1;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t unaff_retaddr;
  undefined8 local_8;
  
  bVar1 = WriteMakeRoom((CNwnMemoryStream *)nCount,unaff_retaddr);
  if (bVar1) {
    memcpy(*(void **)(in_RDI + 0x30),in_RSI,in_RDX);
    *(size_t *)(in_RDI + 0x30) = in_RDX + *(long *)(in_RDI + 0x30);
    local_8 = in_RDX;
    if (*(ulong *)(in_RDI + 0x38) < *(ulong *)(in_RDI + 0x30)) {
      *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(in_RDI + 0x30);
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

virtual size_t Write (void *pBuffer, size_t nCount)
	{
		if(!WriteMakeRoom (nCount))
			return 0;
		memcpy (m_pauchPos, pBuffer, nCount);
		m_pauchPos += nCount;
		if (m_pauchPos > m_pauchEnd)
			m_pauchEnd = m_pauchPos;
		return nCount;
	}